

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O1

string * __thiscall
CoreML::rangeToString_abi_cxx11_
          (string *__return_storage_ptr__,CoreML *this,int64_t min,int64_t max,bool useArrayFormat)

{
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  stringstream ss;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  if ((int)max == 0) {
    if (this == (CoreML *)min) {
      poVar1 = local_1a0;
    }
    else {
      if (min < 0) {
        poVar1 = std::ostream::_M_insert<long>((long)local_1a0);
        lVar2 = 3;
        pcVar3 = "...";
        goto LAB_002e8643;
      }
      poVar1 = std::ostream::_M_insert<long>((long)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"...",3);
    }
    std::ostream::_M_insert<long>((long)poVar1);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"[",1);
    poVar1 = std::ostream::_M_insert<long>((long)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
    poVar1 = std::ostream::_M_insert<long>((long)poVar1);
    lVar2 = 1;
    pcVar3 = "]";
LAB_002e8643:
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar3,lVar2);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

static std::string rangeToString(int64_t min, int64_t max, bool useArrayFormat = false) {
        std::stringstream ss;

        if (useArrayFormat) {
            ss << "[" << min << ", " << max << "]";
        } else {
            if (min == max) {
                ss << min;
            } else if (max < 0) {
                ss << min << "...";
            } else {
                ss << min << "..." << max;
            }
        }
        return ss.str();
    }